

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jsrt.cpp
# Opt level: O0

JsErrorCode JsStringToPointer(JsValueRef stringValue,WCHAR **stringPtr,size_t *stringLength)

{
  anon_class_24_3_f40bbfd1 fn;
  bool bVar1;
  size_t *local_28;
  size_t *stringLength_local;
  WCHAR **stringPtr_local;
  JsValueRef stringValue_local;
  
  if (stringValue == (JsValueRef)0x0) {
    stringValue_local._4_4_ = JsErrorInvalidArgument;
  }
  else if (stringPtr == (WCHAR **)0x0) {
    stringValue_local._4_4_ = JsErrorNullArgument;
  }
  else {
    *stringPtr = (WCHAR *)0x0;
    if (stringLength == (size_t *)0x0) {
      stringValue_local._4_4_ = JsErrorNullArgument;
    }
    else {
      *stringLength = 0;
      local_28 = stringLength;
      stringLength_local = (size_t *)stringPtr;
      stringPtr_local = (WCHAR **)stringValue;
      bVar1 = Js::VarIs<Js::JavascriptString>(stringValue);
      if (bVar1) {
        fn.stringPtr = (WCHAR ***)&local_28;
        fn.stringValue = &stringLength_local;
        fn.stringLength = (size_t **)&stringPtr_local;
        stringValue_local._4_4_ = GlobalAPIWrapper_NoRecord<JsStringToPointer::__0>(fn);
      }
      else {
        stringValue_local._4_4_ = JsErrorInvalidArgument;
      }
    }
  }
  return stringValue_local._4_4_;
}

Assistant:

CHAKRA_API JsStringToPointer(_In_ JsValueRef stringValue, _Outptr_result_buffer_(*stringLength) const WCHAR **stringPtr, _Out_ size_t *stringLength)
{
    VALIDATE_JSREF(stringValue);
    PARAM_NOT_NULL(stringPtr);
    *stringPtr = nullptr;
    PARAM_NOT_NULL(stringLength);
    *stringLength = 0;

    if (!Js::VarIs<Js::JavascriptString>(stringValue))
    {
        return JsErrorInvalidArgument;
    }

    return GlobalAPIWrapper_NoRecord([&]() -> JsErrorCode {
        Js::JavascriptString *jsString = Js::VarTo<Js::JavascriptString>(stringValue);

        *stringPtr = jsString->GetSz();
        *stringLength = jsString->GetLength();
        return JsNoError;
    });
}